

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void av1_alloc_cdef_buffers
               (AV1_COMMON *cm,AV1CdefWorkerData **cdef_worker,AV1CdefSync *cdef_sync,
               int num_workers,int init_worker)

{
  int iVar1;
  uint uVar2;
  AV1_COMMON *pAVar3;
  int iVar4;
  void *pvVar5;
  int in_ECX;
  long *in_RSI;
  AV1_COMMON *in_RDI;
  int in_R8D;
  bool bVar6;
  int idx_2;
  int idx_1;
  int idx;
  int block_height;
  int luma_stride;
  int shift;
  int plane;
  int num_bufs;
  int is_cdef_enabled;
  int is_num_workers_changed;
  int num_mi_rows;
  CdefInfo *cdef_info;
  size_t new_srcbuf_size;
  size_t new_colbuf_size [3];
  size_t new_linebuf_size [3];
  int num_planes;
  AV1CdefRowSync **in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  uint in_stack_ffffffffffffff58;
  uint uVar7;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_88;
  size_t local_70;
  size_t local_68 [4];
  size_t local_48 [4];
  int local_24;
  int local_20;
  int local_1c;
  long *local_10;
  AV1_COMMON *local_8;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24 = av1_num_planes(in_RDI);
  memset(local_48,0,0x18);
  memset(local_68,0,0x18);
  pAVar3 = local_8;
  local_70 = 0;
  iVar4 = ((local_8->mi_params).mi_rows + 0xf) / 0x10;
  bVar6 = (local_8->cdef_info).allocated_num_workers == local_1c;
  uVar7 = in_stack_ffffffffffffff58 & 0xffffff;
  if (local_8->seq_params->enable_cdef != '\0') {
    uVar7 = CONCAT13((local_8->tiles).single_tile_decoding != 0,(int3)in_stack_ffffffffffffff58) ^
            0xff000000;
  }
  uVar2 = uVar7 & 0x1000000;
  local_88 = 3;
  if (1 < local_1c) {
    local_88 = ((local_8->mi_params).mi_rows + 0xf) / 0x10;
  }
  if ((uVar7 & 0x1000000) != 0) {
    local_70 = 0x9480;
    for (in_stack_ffffffffffffff74 = 0; in_stack_ffffffffffffff74 < local_24;
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
      if (in_stack_ffffffffffffff74 == 0) {
        in_stack_ffffffffffffff54 = 0;
      }
      else {
        in_stack_ffffffffffffff54 = local_8->seq_params->subsampling_x;
      }
      in_stack_ffffffffffffff6c = (local_8->mi_params).mi_cols * 4 + 0xfU & 0xfffffff0;
      in_stack_ffffffffffffff48 = (AV1CdefRowSync **)((long)local_88 * 0x20);
      local_48[in_stack_ffffffffffffff74] =
           (long)in_stack_ffffffffffffff48 *
           (long)((int)in_stack_ffffffffffffff6c >> ((byte)in_stack_ffffffffffffff54 & 0x1f));
      in_stack_ffffffffffffff68 = (0x40 << (2 - (byte)in_stack_ffffffffffffff54 & 0x1f)) << 2;
      local_68[in_stack_ffffffffffffff74] = (long)in_stack_ffffffffffffff68 << 4;
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff54;
    }
  }
  free_cdef_linebuf_conditional
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (size_t *)CONCAT44(in_stack_ffffffffffffff5c,uVar7));
  free_cdef_bufs_conditional
            ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (uint16_t **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (uint16_t **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (size_t *)CONCAT44(in_stack_ffffffffffffff5c,uVar7),
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if ((*local_10 != 0) && (local_20 != 0)) {
    if (bVar6) {
      iVar1 = local_1c;
      if (1 < local_1c) {
        while (in_stack_ffffffffffffff60 = iVar1 + -1, 0 < in_stack_ffffffffffffff60) {
          free_cdef_bufs_conditional
                    ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (uint16_t **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (uint16_t **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (size_t *)CONCAT44(in_stack_ffffffffffffff5c,uVar7),
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          iVar1 = in_stack_ffffffffffffff60;
        }
      }
    }
    else {
      in_stack_ffffffffffffff64 = (pAVar3->cdef_info).allocated_num_workers;
      while (in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + -1,
            0 < in_stack_ffffffffffffff64) {
        free_cdef_bufs((uint16_t **)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (uint16_t **)in_stack_ffffffffffffff48);
      }
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      *local_10 = 0;
    }
  }
  if ((pAVar3->cdef_info).allocated_mi_rows != iVar4) {
    free_cdef_row_sync((AV1CdefRowSync **)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  }
  (pAVar3->cdef_info).allocated_srcbuf_size = local_70;
  (pAVar3->cdef_info).allocated_colbuf_size[0] = local_68[0];
  (pAVar3->cdef_info).allocated_colbuf_size[1] = local_68[1];
  (pAVar3->cdef_info).allocated_colbuf_size[2] = local_68[2];
  (pAVar3->cdef_info).allocated_linebuf_size[0] = local_48[0];
  (pAVar3->cdef_info).allocated_linebuf_size[1] = local_48[1];
  (pAVar3->cdef_info).allocated_linebuf_size[2] = local_48[2];
  (pAVar3->cdef_info).allocated_mi_rows = iVar4;
  (pAVar3->cdef_info).allocated_num_workers = local_1c;
  if (uVar2 != 0) {
    alloc_cdef_bufs((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    (uint16_t **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (uint16_t **)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5c);
    alloc_cdef_linebuf((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       (uint16_t **)CONCAT44(in_stack_ffffffffffffff5c,uVar7),
                       in_stack_ffffffffffffff54);
    if (1 < local_1c) {
      if (local_20 != 0) {
        if (*local_10 == 0) {
          pvVar5 = aom_calloc(CONCAT44(in_stack_ffffffffffffff5c,uVar7),
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          *local_10 = (long)pvVar5;
          if (*local_10 == 0) {
            aom_internal_error(local_8->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *cdef_worker")
            ;
          }
        }
        while (iVar4 = local_1c + -1, 0 < iVar4) {
          alloc_cdef_bufs((AV1_COMMON *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          (uint16_t **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                          ,(uint16_t **)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),iVar4);
          local_1c = iVar4;
        }
      }
      alloc_cdef_row_sync((AV1_COMMON *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48,0);
    }
  }
  return;
}

Assistant:

void av1_alloc_cdef_buffers(AV1_COMMON *const cm,
                            AV1CdefWorkerData **cdef_worker,
                            AV1CdefSync *cdef_sync, int num_workers,
                            int init_worker) {
  const int num_planes = av1_num_planes(cm);
  size_t new_linebuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_colbuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_srcbuf_size = 0;
  CdefInfo *const cdef_info = &cm->cdef_info;
  // Check for configuration change
  const int num_mi_rows =
      (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int is_num_workers_changed =
      cdef_info->allocated_num_workers != num_workers;
  const int is_cdef_enabled =
      cm->seq_params->enable_cdef && !cm->tiles.single_tile_decoding;

  // num-bufs=3 represents ping-pong buffers for top linebuf,
  // followed by bottom linebuf.
  // ping-pong is to avoid top linebuf over-write by consecutive row.
  int num_bufs = 3;
  if (num_workers > 1)
    num_bufs = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  if (is_cdef_enabled) {
    // Calculate src buffer size
    new_srcbuf_size = sizeof(*cdef_info->srcbuf) * CDEF_INBUF_SIZE;
    for (int plane = 0; plane < num_planes; plane++) {
      const int shift =
          plane == AOM_PLANE_Y ? 0 : cm->seq_params->subsampling_x;
      // Calculate top and bottom line buffer size
      const int luma_stride =
          ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);
      new_linebuf_size[plane] = sizeof(*cdef_info->linebuf) * num_bufs *
                                (CDEF_VBORDER << 1) * (luma_stride >> shift);
      // Calculate column buffer size
      const int block_height =
          (CDEF_BLOCKSIZE << (MI_SIZE_LOG2 - shift)) * 2 * CDEF_VBORDER;
      new_colbuf_size[plane] =
          sizeof(*cdef_info->colbuf[plane]) * block_height * CDEF_HBORDER;
    }
  }

  // Free src, line and column buffers for worker 0 in case of reallocation
  free_cdef_linebuf_conditional(cm, new_linebuf_size);
  free_cdef_bufs_conditional(cm, cdef_info->colbuf, &cdef_info->srcbuf,
                             new_colbuf_size, new_srcbuf_size);

  // The flag init_worker indicates if cdef_worker has to be allocated for the
  // frame. This is passed as 1 always from decoder. At encoder side, it is 0
  // when called for parallel frames during FPMT (where cdef_worker is shared
  // across parallel frames) and 1 otherwise.
  if (*cdef_worker != NULL && init_worker) {
    if (is_num_workers_changed) {
      // Free src and column buffers for remaining workers in case of change in
      // num_workers
      for (int idx = cdef_info->allocated_num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs((*cdef_worker)[idx].colbuf, &(*cdef_worker)[idx].srcbuf);

      aom_free(*cdef_worker);
      *cdef_worker = NULL;
    } else if (num_workers > 1) {
      // Free src and column buffers for remaining workers in case of
      // reallocation
      for (int idx = num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs_conditional(cm, (*cdef_worker)[idx].colbuf,
                                   &(*cdef_worker)[idx].srcbuf, new_colbuf_size,
                                   new_srcbuf_size);
    }
  }

  if (cdef_info->allocated_mi_rows != num_mi_rows)
    free_cdef_row_sync(&cdef_sync->cdef_row_mt, cdef_info->allocated_mi_rows);

  // Store allocated sizes for reallocation
  cdef_info->allocated_srcbuf_size = new_srcbuf_size;
  av1_copy(cdef_info->allocated_colbuf_size, new_colbuf_size);
  av1_copy(cdef_info->allocated_linebuf_size, new_linebuf_size);
  // Store configuration to check change in configuration
  cdef_info->allocated_mi_rows = num_mi_rows;
  cdef_info->allocated_num_workers = num_workers;

  if (!is_cdef_enabled) return;

  // Memory allocation of column buffer & source buffer (worker_0).
  alloc_cdef_bufs(cm, cdef_info->colbuf, &cdef_info->srcbuf, num_planes);
  alloc_cdef_linebuf(cm, cdef_info->linebuf, num_planes);

  if (num_workers < 2) return;

  if (init_worker) {
    if (*cdef_worker == NULL)
      CHECK_MEM_ERROR(cm, *cdef_worker,
                      aom_calloc(num_workers, sizeof(**cdef_worker)));

    // Memory allocation of column buffer & source buffer for remaining workers.
    for (int idx = num_workers - 1; idx >= 1; idx--)
      alloc_cdef_bufs(cm, (*cdef_worker)[idx].colbuf,
                      &(*cdef_worker)[idx].srcbuf, num_planes);
  }

  alloc_cdef_row_sync(cm, &cdef_sync->cdef_row_mt,
                      cdef_info->allocated_mi_rows);
}